

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O3

void __thiscall
r_comp::Decompiler::write_expression_tail
          (Decompiler *this,uint16_t read_index,bool apply_time_offset,bool vertical)

{
  undefined8 uVar1;
  byte bVar2;
  undefined4 in_EAX;
  undefined7 in_register_00000009;
  uint uVar3;
  ulong uVar4;
  undefined6 in_register_00000032;
  char *pcVar5;
  ostringstream *poVar6;
  ushort uVar7;
  bool after_tail_wildcard;
  undefined4 uStack_38;
  undefined4 local_34;
  
  _uStack_38 = CONCAT44((int)CONCAT71(in_register_00000009,vertical),in_EAX);
  uVar4 = CONCAT62(in_register_00000032,read_index) & 0xffffffff;
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),
             CONCAT62(in_register_00000032,read_index) & 0xffffffff);
  bVar2 = r_code::Atom::getAtomCount();
  uVar1 = _uStack_38;
  uStack_38._0_2_ = (ushort)(byte)uStack_38;
  if (bVar2 != 0) {
    uVar7 = (ushort)bVar2;
    do {
      if (uStack_38._1_1_ == '\x01') {
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
        write_any(this,(uint16_t)uVar3,(bool *)((long)&uStack_38 + 1),apply_time_offset,0);
      }
      else {
        if (this->closing_set == true) {
          this->closing_set = false;
          if (this->horizontal_set == false) {
            write_indent(this,this->indents);
          }
          else {
            poVar6 = this->out_stream->stream;
            uStack_38._0_3_ = CONCAT12(0x20,(ushort)uStack_38);
            pcVar5 = (char *)((long)&uStack_38 + 2);
LAB_00132d2d:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,pcVar5,1);
          }
        }
        else if ((char)local_34 == '\0') {
          poVar6 = this->out_stream->stream;
          uStack_38 = CONCAT13(0x20,(undefined3)uStack_38);
          pcVar5 = (char *)((long)&uStack_38 + 3);
          goto LAB_00132d2d;
        }
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
        write_any(this,(uint16_t)uVar3,(bool *)((long)&uStack_38 + 1),apply_time_offset,0);
        if (this->closing_set == false && (char)((ulong)uVar1 >> 0x20) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this->out_stream->stream,"\n",1);
        }
      }
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

void Decompiler::write_expression_tail(uint16_t read_index, bool apply_time_offset, bool vertical)   // read_index points initially to the head.
{
    uint16_t arity = current_object->code[read_index].getAtomCount();
    bool after_tail_wildcard = false;

    for (uint16_t i = 0; i < arity; ++i) {
        if (after_tail_wildcard) {
            write_any(++read_index, after_tail_wildcard, apply_time_offset);
        } else {
            if (closing_set) {
                closing_set = false;

                if (!horizontal_set) {
                    write_indent(indents);
                } else {
                    *out_stream << ' ';
                }
            } else if (!vertical) {
                *out_stream << ' ';
            }

            write_any(++read_index, after_tail_wildcard, apply_time_offset);

            if (!closing_set && vertical) {
                *out_stream << "\n";
            }
        }
    }
}